

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dashel-common.cpp
# Opt level: O3

string * __thiscall
Dashel::DashelException::sourceToString_abi_cxx11_
          (string *__return_storage_ptr__,DashelException *this,Source s)

{
  allocator<char> local_9;
  
  if ((uint)this < 9) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,
               &DAT_0011bd7c + *(int *)(&DAT_0011bd7c + ((ulong)this & 0xffffffff) * 4),&local_9);
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)__return_storage_ptr__,"Unknown cause","");
  }
  return __return_storage_ptr__;
}

Assistant:

string DashelException::sourceToString(Source s)
	{
		// clang-format off
		const char* const sourceNames[] =
		{
			"Unknown cause",
			"Synchronisation error",
			"Invalid target",
			"Invalid operation",
			"Connection lost",
			"I/O error",
			"Connection failed",
			"Enumeration error",
			"Previous incoming data not read"
		};
		// clang-format on
		const size_t arrayLength(sizeof(sourceNames) / sizeof(const char*));
		if (s >= arrayLength)
			return sourceNames[0];
		else
			return sourceNames[s];
	}